

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

void sgai_median_patch_values
               (Integer type,Integer ndim,Integer *loA,Integer *hiA,Integer *ldA,void *A_ptr,
               void *B_ptr,void *C_ptr,void *M_ptr,Integer offset)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  double *pdVar16;
  long *in_RCX;
  long *in_RDX;
  long in_RSI;
  undefined8 in_RDI;
  long *in_R8;
  long in_R9;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  long in_stack_00000008;
  long in_stack_00000010;
  SingleComplex cm;
  SingleComplex cc;
  SingleComplex cb;
  SingleComplex ca;
  DoubleComplex zm;
  DoubleComplex zc;
  DoubleComplex zb;
  DoubleComplex za;
  long lm;
  long lc;
  long lb;
  long la;
  double dm;
  double dc;
  double db;
  double da;
  float fm;
  float fc;
  float fb;
  float fa;
  int im;
  int ic;
  int ib;
  int ia;
  double nc;
  double nb;
  double na;
  Integer j;
  Integer i;
  Integer n1dim;
  Integer idx;
  Integer baseldA [7];
  Integer bunit [7];
  Integer bvalue [7];
  undefined8 local_1e0;
  float local_1d8;
  float fStackY_1d4;
  float local_1d0;
  float fStackY_1cc;
  float local_1c8;
  float fStackY_1c4;
  double local_1c0;
  double local_1b8;
  long local_180;
  double local_160;
  float local_140;
  int local_130;
  long local_108;
  long local_100;
  long local_f8;
  long local_f0;
  long local_e8 [8];
  long local_a8 [8];
  long local_68 [2];
  Integer in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  long local_30;
  
  local_f8 = 1;
  for (local_100 = 1; local_100 < in_RSI; local_100 = local_100 + 1) {
    local_f8 = ((in_RCX[local_100] - in_RDX[local_100]) + 1) * local_f8;
  }
  local_68[0] = 0;
  local_68[1] = 0;
  local_a8[0] = 1;
  local_a8[1] = 1;
  local_e8[0] = *in_R8;
  local_e8[1] = *in_R8 * in_R8[1];
  for (local_100 = 2; local_100 < in_RSI; local_100 = local_100 + 1) {
    local_68[local_100] = 0;
    local_a8[local_100] =
         local_a8[local_100 + -1] * ((in_RCX[local_100 + -1] - in_RDX[local_100 + -1]) + 1);
    local_e8[local_100] = local_e8[local_100 + -1] * in_R8[local_100];
  }
  switch(in_RDI) {
  case 0x3e9:
    local_30 = in_R9 + (long)cc * 4;
    in_stack_00000008 = in_stack_00000008 + (long)cc * 4;
    in_stack_00000010 = in_stack_00000010 + (long)cc * 4;
    cm = (SingleComplex)((long)cm + (long)cc * 4);
    break;
  case 0x3ea:
    local_30 = in_R9 + (long)cc * 8;
    in_stack_00000008 = in_stack_00000008 + (long)cc * 8;
    in_stack_00000010 = in_stack_00000010 + (long)cc * 8;
    cm = (SingleComplex)((long)cm + (long)cc * 8);
    break;
  case 0x3eb:
    local_30 = in_R9 + (long)cc * 4;
    in_stack_00000008 = in_stack_00000008 + (long)cc * 4;
    in_stack_00000010 = in_stack_00000010 + (long)cc * 4;
    cm = (SingleComplex)((long)cm + (long)cc * 4);
    break;
  case 0x3ec:
    local_30 = in_R9 + (long)cc * 8;
    in_stack_00000008 = in_stack_00000008 + (long)cc * 8;
    in_stack_00000010 = in_stack_00000010 + (long)cc * 8;
    cm = (SingleComplex)((long)cm + (long)cc * 8);
    break;
  default:
    local_30 = in_R9;
    break;
  case 0x3ee:
    local_30 = in_R9 + (long)cc * 8;
    in_stack_00000008 = in_stack_00000008 + (long)cc * 8;
    in_stack_00000010 = in_stack_00000010 + (long)cc * 8;
    cm = (SingleComplex)((long)cm + (long)cc * 8);
    break;
  case 0x3ef:
    local_30 = in_R9 + (long)cc * 0x10;
    in_stack_00000008 = in_stack_00000008 + (long)cc * 0x10;
    in_stack_00000010 = in_stack_00000010 + (long)cc * 0x10;
    cm = (SingleComplex)((long)cm + (long)cc * 0x10);
    break;
  case 0x3f8:
    local_30 = in_R9 + (long)cc * 8;
    in_stack_00000008 = in_stack_00000008 + (long)cc * 8;
    in_stack_00000010 = in_stack_00000010 + (long)cc * 8;
    cm = (SingleComplex)((long)cm + (long)cc * 8);
  }
  switch(in_RDI) {
  case 0x3e9:
    for (local_100 = 0; local_100 < local_f8; local_100 = local_100 + 1) {
      local_f0 = 0;
      for (local_108 = 1; local_108 < in_RSI; local_108 = local_108 + 1) {
        local_f0 = local_68[local_108] * local_e8[local_108 + -1] + local_f0;
        if ((local_100 + 1) % local_a8[local_108] == 0) {
          local_68[local_108] = local_68[local_108] + 1;
        }
        if (in_RCX[local_108] - in_RDX[local_108] < local_68[local_108]) {
          local_68[local_108] = 0;
        }
      }
      for (local_108 = 0; local_108 < (*in_RCX - *in_RDX) + 1; local_108 = local_108 + 1) {
        iVar4 = *(int *)(local_30 + (local_f0 + local_108) * 4);
        iVar5 = *(int *)(in_stack_00000008 + (local_f0 + local_108) * 4);
        iVar6 = *(int *)(in_stack_00000010 + (local_f0 + local_108) * 4);
        local_130 = iVar4;
        if (iVar4 != iVar5) {
          if (iVar4 < iVar5) {
            if (((iVar4 <= iVar6) || (iVar5 <= iVar4)) &&
               ((local_130 = iVar5, iVar4 <= iVar6 && (iVar6 <= iVar5)))) {
              local_130 = iVar6;
            }
          }
          else if (((iVar5 <= iVar6) || (local_130 = iVar5, iVar4 <= iVar5)) &&
                  ((local_130 = iVar4, iVar5 <= iVar6 && (iVar6 <= iVar4)))) {
            local_130 = iVar6;
          }
        }
        *(int *)((long)cm + (local_f0 + local_108) * 4) = local_130;
      }
    }
    break;
  case 0x3ea:
    for (local_100 = 0; local_100 < local_f8; local_100 = local_100 + 1) {
      local_f0 = 0;
      for (local_108 = 1; local_108 < in_RSI; local_108 = local_108 + 1) {
        local_f0 = local_68[local_108] * local_e8[local_108 + -1] + local_f0;
        if ((local_100 + 1) % local_a8[local_108] == 0) {
          local_68[local_108] = local_68[local_108] + 1;
        }
        if (in_RCX[local_108] - in_RDX[local_108] < local_68[local_108]) {
          local_68[local_108] = 0;
        }
      }
      for (local_108 = 0; local_108 < (*in_RCX - *in_RDX) + 1; local_108 = local_108 + 1) {
        lVar7 = *(long *)(local_30 + (local_f0 + local_108) * 8);
        lVar8 = *(long *)(in_stack_00000008 + (local_f0 + local_108) * 8);
        lVar9 = *(long *)(in_stack_00000010 + (local_f0 + local_108) * 8);
        local_180 = lVar7;
        if (lVar7 != lVar8) {
          if (lVar7 < lVar8) {
            if ((((lVar7 <= lVar9) || (lVar8 <= lVar7)) && (local_180 = lVar8, lVar7 <= lVar9)) &&
               (lVar9 <= lVar8)) {
              local_180 = lVar9;
            }
          }
          else if (((lVar8 <= lVar9) || (local_180 = lVar8, lVar7 <= lVar8)) &&
                  ((local_180 = lVar7, lVar8 <= lVar9 && (lVar9 <= lVar7)))) {
            local_180 = lVar9;
          }
        }
        *(long *)((long)cm + (local_f0 + local_108) * 8) = local_180;
      }
    }
    break;
  case 0x3eb:
    for (local_100 = 0; local_100 < local_f8; local_100 = local_100 + 1) {
      local_f0 = 0;
      for (local_108 = 1; local_108 < in_RSI; local_108 = local_108 + 1) {
        local_f0 = local_68[local_108] * local_e8[local_108 + -1] + local_f0;
        if ((local_100 + 1) % local_a8[local_108] == 0) {
          local_68[local_108] = local_68[local_108] + 1;
        }
        if (in_RCX[local_108] - in_RDX[local_108] < local_68[local_108]) {
          local_68[local_108] = 0;
        }
      }
      for (local_108 = 0; local_108 < (*in_RCX - *in_RDX) + 1; local_108 = local_108 + 1) {
        fVar1 = *(float *)(local_30 + (local_f0 + local_108) * 4);
        fVar2 = *(float *)(in_stack_00000008 + (local_f0 + local_108) * 4);
        fVar3 = *(float *)(in_stack_00000010 + (local_f0 + local_108) * 4);
        local_140 = fVar1;
        if ((fVar1 != fVar2) || (NAN(fVar1) || NAN(fVar2))) {
          if (fVar2 <= fVar1) {
            if ((((fVar2 <= fVar3) || (local_140 = fVar2, fVar1 <= fVar2)) &&
                (local_140 = fVar1, fVar2 <= fVar3)) && (fVar3 <= fVar1)) {
              local_140 = fVar3;
            }
          }
          else if (((fVar1 <= fVar3) || (fVar2 <= fVar1)) &&
                  ((local_140 = fVar2, fVar1 <= fVar3 && (fVar3 <= fVar2)))) {
            local_140 = fVar3;
          }
        }
        *(float *)((long)cm + (local_f0 + local_108) * 4) = local_140;
      }
    }
    break;
  case 0x3ec:
    for (local_100 = 0; local_100 < local_f8; local_100 = local_100 + 1) {
      local_f0 = 0;
      for (local_108 = 1; local_108 < in_RSI; local_108 = local_108 + 1) {
        local_f0 = local_68[local_108] * local_e8[local_108 + -1] + local_f0;
        if ((local_100 + 1) % local_a8[local_108] == 0) {
          local_68[local_108] = local_68[local_108] + 1;
        }
        if (in_RCX[local_108] - in_RDX[local_108] < local_68[local_108]) {
          local_68[local_108] = 0;
        }
      }
      for (local_108 = 0; local_108 < (*in_RCX - *in_RDX) + 1; local_108 = local_108 + 1) {
        dVar20 = *(double *)(local_30 + (local_f0 + local_108) * 8);
        dVar21 = *(double *)(in_stack_00000008 + (local_f0 + local_108) * 8);
        dVar22 = *(double *)(in_stack_00000010 + (local_f0 + local_108) * 8);
        local_160 = dVar20;
        if ((dVar20 != dVar21) || (NAN(dVar20) || NAN(dVar21))) {
          if (dVar21 <= dVar20) {
            if ((((dVar21 <= dVar22) || (local_160 = dVar21, dVar20 <= dVar21)) &&
                (local_160 = dVar20, dVar21 <= dVar22)) && (dVar22 <= dVar20)) {
              local_160 = dVar22;
            }
          }
          else if (((dVar20 <= dVar22) || (dVar21 <= dVar20)) &&
                  ((local_160 = dVar21, dVar20 <= dVar22 && (dVar22 <= dVar21)))) {
            local_160 = dVar22;
          }
        }
        *(double *)((long)cm + (local_f0 + local_108) * 8) = local_160;
      }
    }
    break;
  default:
    pnga_error(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    break;
  case 0x3ee:
    for (local_100 = 0; local_100 < local_f8; local_100 = local_100 + 1) {
      local_f0 = 0;
      for (local_108 = 1; local_108 < in_RSI; local_108 = local_108 + 1) {
        local_f0 = local_68[local_108] * local_e8[local_108 + -1] + local_f0;
        if ((local_100 + 1) % local_a8[local_108] == 0) {
          local_68[local_108] = local_68[local_108] + 1;
        }
        if (in_RCX[local_108] - in_RDX[local_108] < local_68[local_108]) {
          local_68[local_108] = 0;
        }
      }
      for (local_108 = 0; local_108 < (*in_RCX - *in_RDX) + 1; local_108 = local_108 + 1) {
        uVar13 = *(undefined8 *)(local_30 + (local_f0 + local_108) * 8);
        uVar14 = *(undefined8 *)(in_stack_00000008 + (local_f0 + local_108) * 8);
        uVar15 = *(undefined8 *)(in_stack_00000010 + (local_f0 + local_108) * 8);
        local_1c8 = (float)uVar13;
        fStackY_1c4 = (float)((ulong)uVar13 >> 0x20);
        dVar20 = sqrt((double)(local_1c8 * local_1c8 + fStackY_1c4 * fStackY_1c4));
        local_1d0 = (float)uVar14;
        fStackY_1cc = (float)((ulong)uVar14 >> 0x20);
        dVar21 = sqrt((double)(local_1d0 * local_1d0 + fStackY_1cc * fStackY_1cc));
        local_1d8 = (float)uVar15;
        fStackY_1d4 = (float)((ulong)uVar15 >> 0x20);
        dVar22 = sqrt((double)(local_1d8 * local_1d8 + fStackY_1d4 * fStackY_1d4));
        local_1e0 = uVar13;
        if ((dVar20 != dVar21) || (NAN(dVar20) || NAN(dVar21))) {
          if (dVar21 <= dVar20) {
            if ((((dVar21 <= dVar22) || (local_1e0 = uVar14, dVar20 <= dVar21)) &&
                (local_1e0 = uVar13, dVar21 <= dVar22)) && (dVar22 <= dVar20)) {
              local_1e0 = uVar15;
            }
          }
          else if (((dVar20 <= dVar22) || (dVar21 <= dVar20)) &&
                  ((local_1e0 = uVar14, dVar20 <= dVar22 && (dVar22 <= dVar21)))) {
            local_1e0 = uVar15;
          }
        }
        *(undefined8 *)((long)cm + (local_f0 + local_108) * 8) = local_1e0;
      }
    }
    break;
  case 0x3ef:
    for (local_100 = 0; local_100 < local_f8; local_100 = local_100 + 1) {
      local_f0 = 0;
      for (local_108 = 1; local_108 < in_RSI; local_108 = local_108 + 1) {
        local_f0 = local_68[local_108] * local_e8[local_108 + -1] + local_f0;
        if ((local_100 + 1) % local_a8[local_108] == 0) {
          local_68[local_108] = local_68[local_108] + 1;
        }
        if (in_RCX[local_108] - in_RDX[local_108] < local_68[local_108]) {
          local_68[local_108] = 0;
        }
      }
      for (local_108 = 0; local_108 < (*in_RCX - *in_RDX) + 1; local_108 = local_108 + 1) {
        pdVar16 = (double *)(local_30 + (local_f0 + local_108) * 0x10);
        dVar20 = *pdVar16;
        dVar21 = pdVar16[1];
        pdVar16 = (double *)(in_stack_00000008 + (local_f0 + local_108) * 0x10);
        dVar22 = *pdVar16;
        dVar10 = pdVar16[1];
        pdVar16 = (double *)(in_stack_00000010 + (local_f0 + local_108) * 0x10);
        dVar11 = *pdVar16;
        dVar12 = pdVar16[1];
        dVar17 = sqrt(dVar20 * dVar20 + dVar21 * dVar21);
        dVar18 = sqrt(dVar22 * dVar22 + dVar10 * dVar10);
        dVar19 = sqrt(dVar11 * dVar11 + dVar12 * dVar12);
        local_1c0 = dVar20;
        local_1b8 = dVar21;
        if ((dVar17 != dVar18) || (NAN(dVar17) || NAN(dVar18))) {
          if (dVar18 <= dVar17) {
            if ((((dVar18 <= dVar19) || (local_1c0 = dVar22, local_1b8 = dVar10, dVar17 <= dVar18))
                && (local_1c0 = dVar20, local_1b8 = dVar21, dVar18 <= dVar19)) && (dVar19 <= dVar17)
               ) {
              local_1c0 = dVar11;
              local_1b8 = dVar12;
            }
          }
          else if (((dVar17 <= dVar19) || (dVar18 <= dVar17)) &&
                  ((local_1c0 = dVar22, local_1b8 = dVar10, dVar17 <= dVar19 && (dVar19 <= dVar18)))
                  ) {
            local_1c0 = dVar11;
            local_1b8 = dVar12;
          }
        }
        pdVar16 = (double *)((long)cm + (local_f0 + local_108) * 0x10);
        *pdVar16 = local_1c0;
        pdVar16[1] = local_1b8;
      }
    }
  }
  return;
}

Assistant:

static void sgai_median_patch_values(Integer type, Integer ndim, Integer *loA,
                              Integer *hiA, Integer *ldA, void *A_ptr,
                              void *B_ptr, void *C_ptr, void *M_ptr,
                              Integer offset)
{
  Integer bvalue[MAXDIM], bunit[MAXDIM], baseldA[MAXDIM];
  Integer idx, n1dim;
  Integer i, j;

  double na, nb, nc;            /*norm of a, norm of b, norm of c */
  int ia, ib, ic, im;
  float fa, fb, fc, fm;
  double da, db, dc, dm;
  long la, lb, lc, lm;
  DoubleComplex za, zb, zc, zm;
  SingleComplex ca, cb, cc, cm;

  /* number of n-element of the first dimension */
  n1dim = 1;
  for (i = 1; i < ndim; i++)
    n1dim *= (hiA[i] - loA[i] + 1);

  /* calculate the destination indices */
  bvalue[0] = 0;
  bvalue[1] = 0;
  bunit[0] = 1;
  bunit[1] = 1;
  /* baseldA[0] = ldA[0]
   * baseldA[1] = ldA[0] * ldA[1]
   * baseldA[2] = ldA[0] * ldA[1] * ldA[2] .....
   */
  baseldA[0] = ldA[0];
  baseldA[1] = baseldA[0] * ldA[1];
  for (i = 2; i < ndim; i++)
  {
    bvalue[i] = 0;
    bunit[i] = bunit[i - 1] * (hiA[i - 1] - loA[i - 1] + 1);
    baseldA[i] = baseldA[i - 1] * ldA[i];
  }
  switch(type) {
    case C_DBL:
      A_ptr = (void*)((double*)(A_ptr) + offset);
      B_ptr = (void*)((double*)(B_ptr) + offset);
      C_ptr = (void*)((double*)(C_ptr) + offset);
      M_ptr = (void*)((double*)(M_ptr) + offset);
      break;
    case C_INT:
      A_ptr = (void*)((int*)(A_ptr) + offset);
      B_ptr = (void*)((int*)(B_ptr) + offset);
      C_ptr = (void*)((int*)(C_ptr) + offset);
      M_ptr = (void*)((int*)(M_ptr) + offset);
      break;
    case C_DCPL:
      A_ptr = (void*)((DoubleComplex*)(A_ptr) + offset);
      B_ptr = (void*)((DoubleComplex*)(B_ptr) + offset);
      C_ptr = (void*)((DoubleComplex*)(C_ptr) + offset);
      M_ptr = (void*)((DoubleComplex*)(M_ptr) + offset);
      break;
    case C_SCPL:
      A_ptr = (void*)((SingleComplex*)(A_ptr) + offset);
      B_ptr = (void*)((SingleComplex*)(B_ptr) + offset);
      C_ptr = (void*)((SingleComplex*)(C_ptr) + offset);
      M_ptr = (void*)((SingleComplex*)(M_ptr) + offset);
      break;
    case C_FLOAT:
      A_ptr = (void*)((float*)(A_ptr) + offset);
      B_ptr = (void*)((float*)(B_ptr) + offset);
      C_ptr = (void*)((float*)(C_ptr) + offset);
      M_ptr = (void*)((float*)(M_ptr) + offset);
      break;
    case C_LONG:
      A_ptr = (void*)((long*)(A_ptr) + offset);
      B_ptr = (void*)((long*)(B_ptr) + offset);
      C_ptr = (void*)((long*)(C_ptr) + offset);
      M_ptr = (void*)((long*)(M_ptr) + offset);
      break;
    case C_LONGLONG:
      A_ptr = (void*)((long long*)(A_ptr) + offset);
      B_ptr = (void*)((long long*)(B_ptr) + offset);
      C_ptr = (void*)((long long*)(C_ptr) + offset);
      M_ptr = (void*)((long long*)(M_ptr) + offset);
      break;
    default:
      break;
  }

  /*compute elementwise median */

  switch (type) {

    case C_INT: 
      for (i = 0; i < n1dim; i++) {
        idx = 0;
        for (j = 1; j < ndim; j++) {
          idx += bvalue[j] * baseldA[j - 1];
          if (((i + 1) % bunit[j]) == 0)     bvalue[j]++;
          if (bvalue[j] > (hiA[j] - loA[j])) bvalue[j] = 0;
        }
        for (j = 0; j < (hiA[0] - loA[0] + 1); j++) {
          ia = ((int *) A_ptr)[idx + j];
          ib = ((int *) B_ptr)[idx + j];
          ic = ((int *) C_ptr)[idx + j];
          median(ia, ib, ic, im);
          ((int *) M_ptr)[idx + j] = im;
        }
      }
      break;
    case C_LONG: 
      for (i = 0; i < n1dim; i++) {
        idx = 0;
        for (j = 1; j < ndim; j++) {
          idx += bvalue[j] * baseldA[j - 1];
          if (((i + 1) % bunit[j]) == 0)     bvalue[j]++;
          if (bvalue[j] > (hiA[j] - loA[j])) bvalue[j] = 0;
        }
        for (j = 0; j < (hiA[0] - loA[0] + 1); j++) {
          la = ((long *) A_ptr)[idx + j];
          lb = ((long *) B_ptr)[idx + j];
          lc = ((long *) C_ptr)[idx + j];
          median(la, lb, lc, lm);
          ((long *) M_ptr)[idx + j] = lm;
        }
      }
      break;
    case C_FLOAT: 
      for (i = 0; i < n1dim; i++) {
        idx = 0;
        for (j = 1; j < ndim; j++) {
          idx += bvalue[j] * baseldA[j - 1];
          if (((i + 1) % bunit[j]) == 0)     bvalue[j]++;
          if (bvalue[j] > (hiA[j] - loA[j])) bvalue[j] = 0;
        }
        for (j = 0; j < (hiA[0] - loA[0] + 1); j++) {
          fa = ((float *) A_ptr)[idx + j];
          fb = ((float *) B_ptr)[idx + j];
          fc = ((float *) C_ptr)[idx + j];
          median(fa, fb, fc, fm);
          ((float *) M_ptr)[idx + j] = fm;
        }
      }
      break;
    case C_DBL: 
      for (i = 0; i < n1dim; i++) {
        idx = 0;
        for (j = 1; j < ndim; j++) {
          idx += bvalue[j] * baseldA[j - 1];
          if (((i + 1) % bunit[j]) == 0)     bvalue[j]++;
          if (bvalue[j] > (hiA[j] - loA[j])) bvalue[j] = 0;
        }
        for (j = 0; j < (hiA[0] - loA[0] + 1); j++) {
          da = ((double *) A_ptr)[idx + j];
          db = ((double *) B_ptr)[idx + j];
          dc = ((double *) C_ptr)[idx + j];
          median(da, db, dc, dm);
          ((double *) M_ptr)[idx + j] = dm;
        }
      }
      break;
    case C_DCPL:
      for (i = 0; i < n1dim; i++) {
        idx = 0;
        for (j = 1; j < ndim; j++) {
          idx += bvalue[j] * baseldA[j - 1];
          if (((i + 1) % bunit[j]) == 0)     bvalue[j]++;
          if (bvalue[j] > (hiA[j] - loA[j])) bvalue[j] = 0;
        }
        for (j = 0; j < (hiA[0] - loA[0] + 1); j++) {
          za = ((DoubleComplex *) A_ptr)[idx + j];
          zb = ((DoubleComplex *) B_ptr)[idx + j];
          zc = ((DoubleComplex *) C_ptr)[idx + j];
          na = sqrt ((za.real) * (za.real) + (za.imag) * (za.imag));
          nb = sqrt ((zb.real) * (zb.real) + (zb.imag) * (zb.imag));
          nc = sqrt ((zc.real) * (zc.real) + (zc.imag) * (zc.imag));
          median_dcpl(na, nb, nc, za, zb, zc, zm);
          ((DoubleComplex *) M_ptr)[idx + j] = zm;
        }
      }
      break;

    case C_SCPL:
      for (i = 0; i < n1dim; i++) {
        idx = 0;
        for (j = 1; j < ndim; j++) {
          idx += bvalue[j] * baseldA[j - 1];
          if (((i + 1) % bunit[j]) == 0)     bvalue[j]++;
          if (bvalue[j] > (hiA[j] - loA[j])) bvalue[j] = 0;
        }
        for (j = 0; j < (hiA[0] - loA[0] + 1); j++) {
          ca = ((SingleComplex *) A_ptr)[idx + j];
          cb = ((SingleComplex *) B_ptr)[idx + j];
          cc = ((SingleComplex *) C_ptr)[idx + j];
          na = sqrt ((ca.real) * (ca.real) + (ca.imag) * (ca.imag));
          nb = sqrt ((cb.real) * (cb.real) + (cb.imag) * (cb.imag));
          nc = sqrt ((cc.real) * (cc.real) + (cc.imag) * (cc.imag));
          median_scpl(na, nb, nc, ca, cb, cc, cm);
          ((SingleComplex *) M_ptr)[idx + j] = cm;
        }
      }
      break;
    default:
      pnga_error("median: wrong data type", type);
  }
}